

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_expressionlistref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,ExpressionListRef *expr)

{
  pointer puVar1;
  pointer puVar2;
  pointer pLVar3;
  ClientContext *context;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::BoundExpressionListRef_*,_false> _Var5;
  pointer puVar6;
  pointer pBVar7;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
  *this_00;
  reference pvVar8;
  reference pvVar9;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  idx_t iVar10;
  pointer pBVar11;
  reference pvVar12;
  reference pvVar13;
  type expr_00;
  long in_RDX;
  LogicalType *type;
  pointer type_00;
  pointer *__ptr;
  ulong __n;
  size_type __n_00;
  ulong uVar14;
  _Head_base<0UL,_duckdb::BoundExpressionListRef_*,_false> local_118;
  bool local_109;
  ulong local_108;
  Binder *local_100;
  long local_f8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_f0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  list;
  undefined1 local_b8 [32];
  InsertBinder binder;
  
  local_100 = (Binder *)expr;
  local_f8 = in_RDX;
  make_uniq<duckdb::BoundExpressionListRef>();
  pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                         *)&local_118);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pBVar7->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_f8 + 0x80))
  ;
  pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                         *)&local_118);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pBVar7->names,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_f8 + 0x98));
  local_109 = local_100->can_contain_nulls;
  InsertBinder::InsertBinder(&binder,local_100,local_100->context);
  LogicalType::LogicalType((LogicalType *)&list,INVALID);
  LogicalType::operator=(&binder.super_ExpressionBinder.target_type,(LogicalType *)&list);
  LogicalType::~LogicalType((LogicalType *)&list);
  this_00 = (vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
             *)(local_f8 + 0x68);
  __n_00 = 0;
  while (__n_00 < (ulong)((*(long *)(local_f8 + 0x70) - *(long *)(local_f8 + 0x68)) / 0x18)) {
    local_108 = __n_00;
    pvVar8 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
             ::get<true>(this_00,__n_00);
    pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
             ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                           *)&local_118);
    if ((pBVar7->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pBVar7->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (uVar14 = 0;
          uVar14 < (ulong)((long)(pvVar8->
                                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar8->
                                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar14 = uVar14 + 1) {
        pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                 ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                               *)&local_118);
        ::std::__cxx11::to_string((string *)local_b8,uVar14);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&list,
                         "col",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b8);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pBVar7->names,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&list);
        ::std::__cxx11::string::~string((string *)&list);
        ::std::__cxx11::string::~string((string *)local_b8);
      }
    }
    local_100->can_contain_nulls = true;
    list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar14 = 0;
        uVar14 < (ulong)((long)(pvVar8->
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar8->
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar14 = uVar14 + 1)
    {
      pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                             *)&local_118);
      if ((pBVar7->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pBVar7->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                 ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                               *)&local_118);
        pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(&pBVar7->types,uVar14);
        LogicalType::operator=(&binder.super_ExpressionBinder.target_type,pvVar9);
      }
      result_type.ptr =
           (LogicalType *)
           vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
           ::get<true>(pvVar8,uVar14);
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_b8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&binder,result_type,false);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&list,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_b8);
      if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_b8._0_8_ + 8))();
      }
    }
    pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
             ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                           *)&local_118);
    ::std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>>
    ::
    emplace_back<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
              ((vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>>
                *)&pBVar7->values,&list);
    local_100->can_contain_nulls = local_109;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&list);
    __n_00 = local_108 + 1;
  }
  pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                         *)&local_118);
  if (((pBVar7->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pBVar7->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (*(long *)(local_f8 + 0x68) != *(long *)(local_f8 + 0x70))) {
    pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
             ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                           *)&local_118);
    pvVar8 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
             ::get<true>(this_00,0);
    puVar1 = (pvVar8->
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pvVar8->
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    LogicalType::LogicalType((LogicalType *)&list,SQLNULL);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::resize
              (&(pBVar7->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (long)puVar2 - (long)puVar1 >> 3,(value_type *)&list);
    LogicalType::~LogicalType((LogicalType *)&list);
    local_108 = 0;
    while( true ) {
      pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                             *)&local_118);
      if ((ulong)(((long)(pBVar7->values).
                         super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                         .
                         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar7->values).
                        super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                        .
                        super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= local_108) break;
      pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                             *)&local_118);
      pvVar12 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
                ::get<true>(&pBVar7->values,local_108);
      for (uVar14 = 0;
          uVar14 < (ulong)((long)(pvVar12->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar12->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar14 = uVar14 + 1) {
        pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                 ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                               *)&local_118);
        pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(&pBVar7->types,uVar14);
        pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(pvVar12,uVar14);
        expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(pvVar13);
        ExpressionBinder::GetExpressionReturnType((LogicalType *)&list,expr_00);
        LogicalType::MaxLogicalType
                  ((LogicalType *)local_b8,local_100->context,pvVar9,(LogicalType *)&list);
        pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                 ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                               *)&local_118);
        pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(&pBVar7->types,uVar14);
        LogicalType::operator=(pvVar9,(LogicalType *)local_b8);
        LogicalType::~LogicalType((LogicalType *)local_b8);
        LogicalType::~LogicalType((LogicalType *)&list);
      }
      local_108 = local_108 + 1;
    }
    pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
             ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                           *)&local_118);
    pLVar3 = (pBVar7->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (type_00 = (pBVar7->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start; type_00 != pLVar3;
        type_00 = type_00 + 1) {
      LogicalType::NormalizeType((LogicalType *)&list,type_00);
      LogicalType::operator=(type_00,(LogicalType *)&list);
      LogicalType::~LogicalType((LogicalType *)&list);
    }
    uVar14 = 0;
    while( true ) {
      pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                             *)&local_118);
      if ((ulong)(((long)(pBVar7->values).
                         super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                         .
                         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar7->values).
                        super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                        .
                        super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar14) break;
      pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                             *)&local_118);
      pvVar12 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
                ::get<true>(&pBVar7->values,uVar14);
      local_108 = uVar14;
      for (__n = 0; __n < (ulong)((long)(pvVar12->
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar12->
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n = __n + 1) {
        context = local_100->context;
        pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(pvVar12,__n);
        local_f0._M_head_impl =
             (pvVar13->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar13->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                 ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                               *)&local_118);
        pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(&pBVar7->types,__n);
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)&list,context,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_f0,pvVar9,false);
        pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(pvVar12,__n);
        puVar6 = list.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        list.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Var4._M_head_impl =
             (pvVar13->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar13->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)puVar6;
        if (_Var4._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
        }
        if (list.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)&((((list.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         )._M_t.
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
        list.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (local_f0._M_head_impl != (Expression *)0x0) {
          (*((local_f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_f0._M_head_impl = (Expression *)0x0;
      }
      uVar14 = local_108 + 1;
    }
  }
  iVar10 = GenerateTableIndex(local_100);
  pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                         *)&local_118);
  pBVar7->bind_index = iVar10;
  pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                         *)&local_118);
  iVar10 = pBVar7->bind_index;
  pBVar7 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                         *)&local_118);
  pBVar11 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                          *)&local_118);
  BindContext::AddGenericBinding
            (&local_100->bind_context,iVar10,(string *)(local_f8 + 0x10),&pBVar7->names,
             &pBVar11->types);
  _Var5._M_head_impl = local_118._M_head_impl;
  local_118._M_head_impl = (BoundExpressionListRef *)0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var5._M_head_impl;
  ExpressionBinder::~ExpressionBinder(&binder.super_ExpressionBinder);
  if (local_118._M_head_impl != (BoundExpressionListRef *)0x0) {
    (*((local_118._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef[1])();
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(ExpressionListRef &expr) {
	auto result = make_uniq<BoundExpressionListRef>();
	result->types = expr.expected_types;
	result->names = expr.expected_names;
	auto prev_can_contain_nulls = this->can_contain_nulls;
	// bind value list
	InsertBinder binder(*this, context);
	binder.target_type = LogicalType(LogicalTypeId::INVALID);
	for (idx_t list_idx = 0; list_idx < expr.values.size(); list_idx++) {
		auto &expression_list = expr.values[list_idx];
		if (result->names.empty()) {
			// no names provided, generate them
			for (idx_t val_idx = 0; val_idx < expression_list.size(); val_idx++) {
				result->names.push_back("col" + to_string(val_idx));
			}
		}

		this->can_contain_nulls = true;
		vector<unique_ptr<Expression>> list;
		for (idx_t val_idx = 0; val_idx < expression_list.size(); val_idx++) {
			if (!result->types.empty()) {
				D_ASSERT(result->types.size() == expression_list.size());
				binder.target_type = result->types[val_idx];
			}
			auto bound_expr = binder.Bind(expression_list[val_idx]);
			list.push_back(std::move(bound_expr));
		}
		result->values.push_back(std::move(list));
		this->can_contain_nulls = prev_can_contain_nulls;
	}
	if (result->types.empty() && !expr.values.empty()) {
		// there are no types specified
		// we have to figure out the result types
		// for each column, we iterate over all of the expressions and select the max logical type
		// we initialize all types to SQLNULL
		result->types.resize(expr.values[0].size(), LogicalType::SQLNULL);
		// now loop over the lists and select the max logical type
		for (idx_t list_idx = 0; list_idx < result->values.size(); list_idx++) {
			auto &list = result->values[list_idx];
			for (idx_t val_idx = 0; val_idx < list.size(); val_idx++) {
				auto &current_type = result->types[val_idx];
				auto next_type = ExpressionBinder::GetExpressionReturnType(*list[val_idx]);
				result->types[val_idx] = LogicalType::MaxLogicalType(context, current_type, next_type);
			}
		}
		for (auto &type : result->types) {
			type = LogicalType::NormalizeType(type);
		}
		// finally do another loop over the expressions and add casts where required
		for (idx_t list_idx = 0; list_idx < result->values.size(); list_idx++) {
			auto &list = result->values[list_idx];
			for (idx_t val_idx = 0; val_idx < list.size(); val_idx++) {
				list[val_idx] =
				    BoundCastExpression::AddCastToType(context, std::move(list[val_idx]), result->types[val_idx]);
			}
		}
	}
	result->bind_index = GenerateTableIndex();
	bind_context.AddGenericBinding(result->bind_index, expr.alias, result->names, result->types);
	return std::move(result);
}